

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
llvm::sys::Process::FindInEnvPath
          (Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,StringRef EnvName,StringRef FileName,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          IgnoreList)

{
  StringRef Source;
  StringRef Name;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_t sVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__it;
  long lVar7;
  long lVar8;
  StringRef Delimiters;
  char EnvPathSeparatorStr [2];
  StringRef Dir;
  char *in_stack_fffffffffffffde8;
  size_t in_stack_fffffffffffffdf0;
  long lVar9;
  Child local_1f0;
  ulong local_1e8;
  StringRef FileName_local;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> OptPath
  ;
  string local_1a0;
  Twine local_180;
  Twine local_168;
  SmallVector<llvm::StringRef,_8U> Dirs;
  SmallString<128U> FilePath;
  
  FileName_local.Length = FileName.Length;
  FileName_local.Data = FileName.Data;
  Twine::Twine((Twine *)&Dirs,&FileName_local);
  bVar1 = sys::path::is_absolute((Twine *)&Dirs,native);
  if (bVar1) {
    __assert_fail("!path::is_absolute(FileName)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Process.cpp"
                  ,0x26,
                  "static Optional<std::string> llvm::sys::Process::FindInEnvPath(StringRef, StringRef, ArrayRef<std::string>)"
                 );
  }
  (__return_storage_ptr__->Storage).hasVal = false;
  Name.Length = in_stack_fffffffffffffdf0;
  Name.Data = in_stack_fffffffffffffde8;
  GetEnv_abi_cxx11_(Name);
  if (OptPath.Storage.hasVal == true) {
    EnvPathSeparatorStr[0] = ':';
    EnvPathSeparatorStr[1] = '\0';
    Dirs.super_SmallVectorImpl<llvm::StringRef>.super_SmallVectorTemplateBase<llvm::StringRef,_true>
    .super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
         &Dirs.super_SmallVectorStorage<llvm::StringRef,_8U>;
    Dirs.super_SmallVectorImpl<llvm::StringRef>.super_SmallVectorTemplateBase<llvm::StringRef,_true>
    .super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
    Dirs.super_SmallVectorImpl<llvm::StringRef>.super_SmallVectorTemplateBase<llvm::StringRef,_true>
    .super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 8;
    pbVar2 = Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::getPointer(&OptPath);
    Source.Data = (pbVar2->_M_dataplus)._M_p;
    Source.Length = pbVar2->_M_string_length;
    sVar3 = strlen(EnvPathSeparatorStr);
    Delimiters.Length = sVar3;
    Delimiters.Data = EnvPathSeparatorStr;
    SplitString(Source,&Dirs.super_SmallVectorImpl<llvm::StringRef>,Delimiters);
    puVar4 = (undefined8 *)
             ((Dirs.super_SmallVectorImpl<llvm::StringRef>.
               super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
              0xffffffff) * 0x10 +
             (long)Dirs.super_SmallVectorImpl<llvm::StringRef>.
                   super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                   BeginX);
    pbVar2 = IgnoreList.Data + IgnoreList.Length;
    lVar8 = IgnoreList.Length * 0x20;
    for (puVar5 = (undefined8 *)
                  Dirs.super_SmallVectorImpl<llvm::StringRef>.
                  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX; puVar5 != puVar4; puVar5 = puVar5 + 2) {
      Dir.Data = (char *)*puVar5;
      Dir.Length = puVar5[1];
      lVar9 = lVar8;
      if (Dir.Length != 0) {
        FilePath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.BeginX = &Dir;
        __it = IgnoreList.Data;
        for (lVar7 = (long)IgnoreList.Length >> 2; pbVar6 = __it, 0 < lVar7; lVar7 = lVar7 + -1) {
          bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                  ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                *)&FilePath.super_SmallVector<char,_128U>,__it);
          if (bVar1) goto LAB_0014fdc2;
          bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                  ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                *)&FilePath.super_SmallVector<char,_128U>,__it + 1);
          pbVar6 = __it + 1;
          if (bVar1) goto LAB_0014fdc2;
          bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                  ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                *)&FilePath.super_SmallVector<char,_128U>,__it + 2);
          pbVar6 = __it + 2;
          if (bVar1) goto LAB_0014fdc2;
          bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                  ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                *)&FilePath.super_SmallVector<char,_128U>,__it + 3);
          pbVar6 = __it + 3;
          if (bVar1) goto LAB_0014fdc2;
          __it = __it + 4;
          lVar8 = lVar8 + -0x80;
        }
        lVar8 = lVar8 >> 5;
        if (lVar8 == 1) {
LAB_0014fe7d:
          bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                  ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                *)&FilePath.super_SmallVector<char,_128U>,__it);
          pbVar6 = __it;
          if (bVar1) goto LAB_0014fdc2;
        }
        else {
          if (lVar8 == 2) {
LAB_0014fda3:
            bVar1 = __gnu_cxx::__ops::
                    _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                    ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                  *)&FilePath.super_SmallVector<char,_128U>,pbVar6);
            if (!bVar1) {
              __it = pbVar6 + 1;
              goto LAB_0014fe7d;
            }
          }
          else {
            if (lVar8 != 3) goto LAB_0014fdcd;
            bVar1 = __gnu_cxx::__ops::
                    _Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::$_0>
                    ::operator()((_Iter_pred<llvm::sys::Process::FindInEnvPath(llvm::StringRef,llvm::StringRef,llvm::ArrayRef<std::__cxx11::string>)::__0>
                                  *)&FilePath.super_SmallVector<char,_128U>,__it);
            if (!bVar1) {
              pbVar6 = __it + 1;
              goto LAB_0014fda3;
            }
          }
LAB_0014fdc2:
          if (pbVar6 != pbVar2) goto LAB_0014fe6a;
        }
LAB_0014fdcd:
        SmallVector<char,128u>::SmallVector<char_const*,void>
                  (&FilePath.super_SmallVector<char,_128U>,Dir.Data,Dir.Data + Dir.Length);
        Twine::Twine((Twine *)&local_1a0,&FileName_local);
        Twine::Twine((Twine *)&local_1f0,"");
        Twine::Twine(&local_168,"");
        Twine::Twine(&local_180,"");
        sys::path::append(&FilePath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>,
                          (Twine *)&local_1a0,(Twine *)&local_1f0,&local_168,&local_180);
        Twine::Twine((Twine *)&local_1a0,
                     &FilePath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>);
        bVar1 = fs::exists((Twine *)&local_1a0);
        if (bVar1) {
          local_1e8 = (ulong)FilePath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
          local_1f0.twine =
               (Twine *)FilePath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                        super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
          StringRef::str_abi_cxx11_(&local_1a0,(StringRef *)&local_1f0);
          optional_detail::
          OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ::operator=(&__return_storage_ptr__->Storage,&local_1a0);
          std::__cxx11::string::_M_dispose();
          SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&FilePath);
          break;
        }
        SmallVectorImpl<char>::~SmallVectorImpl
                  (&FilePath.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>);
      }
LAB_0014fe6a:
      lVar8 = lVar9;
    }
    SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl(&Dirs.super_SmallVectorImpl<llvm::StringRef>)
    ;
  }
  optional_detail::
  OptionalStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::reset(&OptPath.Storage);
  return __return_storage_ptr__;
}

Assistant:

Optional<std::string> Process::FindInEnvPath(StringRef EnvName,
                                             StringRef FileName,
                                             ArrayRef<std::string> IgnoreList) {
  assert(!path::is_absolute(FileName));
  Optional<std::string> FoundPath;
  Optional<std::string> OptPath = Process::GetEnv(EnvName);
  if (!OptPath.hasValue())
    return FoundPath;

  const char EnvPathSeparatorStr[] = {EnvPathSeparator, '\0'};
  SmallVector<StringRef, 8> Dirs;
  SplitString(OptPath.getValue(), Dirs, EnvPathSeparatorStr);

  for (StringRef Dir : Dirs) {
    if (Dir.empty())
      continue;

    if (any_of(IgnoreList, [&](StringRef S) { return fs::equivalent(S, Dir); }))
      continue;

    SmallString<128> FilePath(Dir);
    path::append(FilePath, FileName);
    if (fs::exists(Twine(FilePath))) {
      FoundPath = FilePath.str();
      break;
    }
  }

  return FoundPath;
}